

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.c
# Opt level: O2

TestSuite * unit_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("unit_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/unit_tests.c"
                      ,0x3e);
  set_setup(pTVar1,unit_tests_setup);
  add_test_(pTVar1,"count_tests_return_zero_for_empty_suite",
            &CgreenSpec__Unittests__count_tests_return_zero_for_empty_suite__);
  add_test_(pTVar1,"count_tests_return_one_for_suite_with_one_testcase",
            &CgreenSpec__Unittests__count_tests_return_one_for_suite_with_one_testcase__);
  add_test_(pTVar1,"count_tests_return_four_for_four_nested_suite_with_one_testcase_each",
            &
            CgreenSpec__Unittests__count_tests_return_four_for_four_nested_suite_with_one_testcase_each__
           );
  set_teardown(pTVar1,unit_tests_teardown);
  return pTVar1;
}

Assistant:

TestSuite *unit_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, unit_tests_setup);

    add_test_with_context(suite, Unittests, count_tests_return_zero_for_empty_suite);
    add_test_with_context(suite, Unittests, count_tests_return_one_for_suite_with_one_testcase);
    add_test_with_context(suite, Unittests, count_tests_return_four_for_four_nested_suite_with_one_testcase_each);

    set_teardown(suite, unit_tests_teardown);
    return suite;
}